

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O3

uint32_t helper_vfp_touhh_arm(uint32_t x,uint32_t shift,void *fpst)

{
  uint16_t uVar1;
  uint uVar2;
  
  if ((x & 0x7fff) < 0x7c01) {
    uVar1 = float16_to_uint16_scalbn_arm
                      ((float16)x,(int)*(char *)((long)fpst + 1),shift,(float_status *)fpst);
    uVar2 = (uint)uVar1;
  }
  else {
    float_raise_arm('\x01',(float_status *)fpst);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t HELPER(vfp_touhh)(uint32_t x, uint32_t shift, void *fpst)
{
    if (unlikely(float16_is_any_nan(x))) {
        float_raise(float_flag_invalid, fpst);
        return 0;
    }
    return float16_to_uint16_scalbn(x, get_float_rounding_mode(fpst),
                                    shift, fpst);
}